

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall
CConnman::ThreadOpenConnections
          (CConnman *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          connect,Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  seed_nodes)

{
  CThreadInterrupt *this_00;
  ConnectionType CVar1;
  int iVar2;
  ServiceFlags SVar3;
  CChainParams *pCVar4;
  byte *pbVar5;
  pointer ppCVar6;
  CNode *pCVar7;
  pointer pCVar8;
  AddrMan *this_01;
  double dVar9;
  long lVar10;
  undefined8 uVar11;
  string_view source_file;
  optional<Network> network;
  _Base_ptr p_Var12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  uint16_t uVar20;
  Network NVar21;
  int iVar22;
  time_point tVar23;
  uint64_t uVar24;
  size_t sVar25;
  long lVar26;
  Logger *pLVar27;
  const_iterator cVar28;
  const_iterator cVar29;
  time_point tVar30;
  duration rel_time;
  microseconds mVar31;
  long in_RCX;
  char *pcVar32;
  ulong uVar33;
  int iVar34;
  pointer pCVar35;
  CAddress *this_02;
  void *__stat_loc;
  uint uVar36;
  ulong uVar37;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar38;
  pointer pcVar39;
  long lVar40;
  bool bVar41;
  pointer pcVar42;
  string *strDest;
  iterator __first;
  pointer ppCVar43;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  Span<const_std::byte> sp;
  string_view str;
  string_view logging_function_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar44;
  undefined7 in_stack_fffffffffffffb88;
  ConnectionType local_470;
  uint local_46c;
  int local_430;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  duration local_3f0;
  char *local_378;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  fixed_seed_networks;
  optional<Network> preferred_net;
  CSemaphoreGrant local_328;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [16];
  undefined1 auStack_288 [24];
  NodeSeconds local_270;
  __pthread_internal_list *p_Stack_268;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  outbound_ipv46_peer_netgroups;
  direct_or_indirect local_230;
  uint local_220;
  _Base_ptr local_218;
  uint16_t local_210;
  FastRandomContext rng;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock77;
  uint local_170;
  direct_or_indirect local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  uint16_t local_138;
  duration local_130;
  __pthread_internal_list *p_Stack_128;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock76;
  __native_type local_110;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_e8;
  vector<CAddress,_std::allocator<CAddress>_> seed_addrs;
  string local_78;
  string local_58;
  long local_38;
  
  pbVar44 = seed_nodes.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rng,false);
  pcVar39 = (pbVar44->_M_dataplus)._M_p;
  pcVar42 = (pointer)pbVar44->_M_string_length;
  if (pcVar39 == pcVar42) {
    tVar23 = NodeClock::now();
    lVar10 = (long)tVar23.__d.__r / 1000;
    uVar24 = FastRandomContext::rand64(&rng);
    dVar9 = MakeExponentiallyDistributed(uVar24);
    local_408 = (long)ROUND((float)(dVar9 * 120000000.0) + 0.5) + lVar10;
    uVar24 = FastRandomContext::rand64(&rng);
    dVar9 = MakeExponentiallyDistributed(uVar24);
    local_400 = (long)ROUND((float)(dVar9 * 300000000.0) + 0.5) + lVar10;
    uVar24 = FastRandomContext::rand64(&rng);
    dVar9 = MakeExponentiallyDistributed(uVar24);
    local_410 = (long)ROUND((float)(dVar9 * 300000000.0) + 0.5) + lVar10;
    criticalblock76.super_unique_lock._M_device = (mutex_type *)&local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock76,"-dnsseed","");
    bVar14 = ArgsManager::GetBoolArg(&gArgs,(string *)&criticalblock76,true);
    if ((__native_type *)criticalblock76.super_unique_lock._M_device != &local_110) {
      operator_delete(criticalblock76.super_unique_lock._M_device,
                      CONCAT44(local_110.__data.__count,local_110.__data.__lock) + 1);
    }
    criticalblock76.super_unique_lock._M_device = (mutex_type *)&local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock76,"-fixedseeds","");
    bVar13 = ArgsManager::GetBoolArg(&gArgs,(string *)&criticalblock76,true);
    if ((__native_type *)criticalblock76.super_unique_lock._M_device != &local_110) {
      operator_delete(criticalblock76.super_unique_lock._M_device,
                      CONCAT44(local_110.__data.__count,local_110.__data.__lock) + 1);
    }
    criticalblock76.super_unique_lock._M_device = (mutex_type *)&local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock76,"-seednode","");
    bVar15 = ArgsManager::IsArgSet(&gArgs,(string *)&criticalblock76);
    if ((__native_type *)criticalblock76.super_unique_lock._M_device != &local_110) {
      operator_delete(criticalblock76.super_unique_lock._M_device,
                      CONCAT44(local_110.__data.__count,local_110.__data.__lock) + 1);
    }
    local_3f0.__r = (rep)NodeClock::now();
    sVar25 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    if (!bVar13) {
      logging_function._M_str = "ThreadOpenConnections";
      logging_function._M_len = 0x15;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_00._M_len = 0x50;
      ::LogPrintf_<>(logging_function,source_file_00,0x9c1,ALL,Info,"Fixed seeds are disabled\n");
    }
    bVar41 = sVar25 == 0 && in_RCX != 0;
    this_00 = &this->interruptNet;
    bVar14 = bVar14 | bVar15;
    local_418 = in_RCX;
    do {
      bVar15 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar15) break;
      if (bVar41) {
        local_418 = local_418 + -1;
        strDest = (string *)(local_418 * 0x20 + seed_nodes.m_size);
        AddAddrFetch(this,strDest);
        sVar25 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
        if (sVar25 == 0) {
          logging_function_01._M_str = "ThreadOpenConnections";
          logging_function_01._M_len = 0x15;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_02._M_len = 0x50;
          ::LogPrintf_<std::__cxx11::string>
                    (logging_function_01,source_file_02,0x9cc,ALL,Info,
                     "Empty addrman, adding seednode (%s) to addrfetch\n",strDest);
        }
        else {
          criticalblock76.super_unique_lock._M_device = (mutex_type *)0xa;
          logging_function_00._M_str = "ThreadOpenConnections";
          logging_function_00._M_len = 0x15;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_01._M_len = 0x50;
          LogPrintf_<long,std::__cxx11::string>
                    (logging_function_00,source_file_01,0x9ce,ALL,Info,
                     "Couldn\'t connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n"
                     ,(long *)&criticalblock76,strDest);
        }
      }
      ProcessAddrFetch(this);
      __stat_loc = (void *)0x1dcd6500;
      bVar15 = CThreadInterrupt::sleep_for(this_00,(duration)0x1dcd6500);
      if (!bVar15) break;
      PerformReconnections(this);
      local_328.sem =
           (this->semOutbound)._M_t.
           super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
           super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
           super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
      CSemaphore::wait(local_328.sem,__stat_loc);
      local_328.fHaveGrant = true;
      bVar15 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar15) {
        iVar22 = 1;
        bVar41 = false;
      }
      else {
        GetReachableEmptyNetworks(&fixed_seed_networks,this);
        if ((fixed_seed_networks._M_h._M_element_count != 0 & bVar13) == 1) {
          tVar23 = NodeClock::now();
          lVar26 = ((long)tVar23.__d.__r / 1000000000) * 1000000;
          if (lVar26 - (lVar10 + 60000000) == 0 || lVar26 < lVar10 + 60000000) {
            bVar13 = true;
            if (bVar14 == 0) {
              criticalblock76.super_unique_lock._8_8_ =
                   criticalblock76.super_unique_lock._8_8_ & 0xffffffffffffff00;
              criticalblock76.super_unique_lock._M_device = &(this->m_added_nodes_mutex).super_mutex
              ;
              std::unique_lock<std::mutex>::lock(&criticalblock76.super_unique_lock);
              if ((this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                logging_function_04._M_str = "ThreadOpenConnections";
                logging_function_04._M_len = 0x15;
                source_file_05._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_05._M_len = 0x50;
                pcVar32 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
                ::LogPrintf_<>(logging_function_04,source_file_05,0x9ef,ALL,Info,
                               "Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n"
                              );
                std::unique_lock<std::mutex>::~unique_lock(&criticalblock76.super_unique_lock);
                goto LAB_001aa2d9;
              }
              std::unique_lock<std::mutex>::~unique_lock(&criticalblock76.super_unique_lock);
            }
          }
          else {
            logging_function_02._M_str = "ThreadOpenConnections";
            logging_function_02._M_len = 0x15;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_03._M_len = 0x50;
            pcVar32 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            ::LogPrintf_<>(logging_function_02,source_file_03,0x9e7,ALL,Info,
                           "Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n"
                          );
LAB_001aa2d9:
            pCVar4 = this->m_params;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            FastRandomContext::FastRandomContext((FastRandomContext *)&criticalblock76,false);
            pbVar5 = (pCVar4->vFixedSeeds).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sp.m_size = (long)(pCVar4->vFixedSeeds).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
            sp.m_data = pbVar5;
            DataStream::DataStream((DataStream *)&local_158.indirect_contents,sp);
            local_298._0_8_ = &CAddress::V2_NETWORK;
            local_298._8_8_ = local_158.indirect_contents.indirect;
            auStack_288._0_8_ = local_158._8_8_;
            auStack_288._8_8_ = local_148._M_allocated_capacity;
            auStack_288._16_8_ = local_148._8_8_;
            local_158.indirect_contents.indirect = (char *)0x0;
            local_158._8_8_ = 0;
            local_148._M_allocated_capacity = 0;
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       &local_158.indirect_contents);
            while ((pointer)((long)(_Rb_tree_color *)auStack_288._16_8_ + local_298._8_8_) !=
                   (pointer)auStack_288._0_8_) {
              CService::CService((CService *)&outbound_ipv46_peer_netgroups);
              CNetAddr::Unserialize<ParamsStream<DataStream,CAddress::SerParams>>
                        ((CNetAddr *)&outbound_ipv46_peer_netgroups,
                         (ParamsStream<DataStream,_CAddress::SerParams> *)local_298);
              local_158.indirect_contents.indirect = (char *)0x0;
              DataStream::read((DataStream *)(local_298 + 8),(int)&local_158 + 6,(void *)0x2,
                               (size_t)pcVar32);
              outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)
                   CONCAT62(outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_right._2_6_,
                            (ushort)(byte)((ulong)local_158._0_8_ >> 0x38) |
                            (ushort)((ulong)local_158._0_8_ >> 0x28) & 0xff00);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &outbound_ipv46_peer_netgroups);
              p_Var12 = outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              uVar20 = (uint16_t)
                       outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_right;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_158.indirect_contents,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77);
              local_148._8_8_ = p_Var12;
              local_138 = uVar20;
              local_130.__r = 100000000;
              p_Stack_128 = (__pthread_internal_list *)0x9;
              if (0x10 < local_170) {
                free(criticalblock77.super_unique_lock._M_device);
                criticalblock77.super_unique_lock._M_device = (mutex_type *)0x0;
              }
              tVar23 = NodeClock::now();
              pcVar32 = (char *)0x112e0be826d694b3;
              do {
                uVar24 = RandomMixin<FastRandomContext>::randbits
                                   ((RandomMixin<FastRandomContext> *)&criticalblock76,0x14);
              } while (0x93a7f < uVar24);
              local_130.__r = ((long)tVar23.__d.__r / 1000000000 - uVar24) + -0x93a80;
              pLVar27 = LogInstance();
              bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
              if (bVar13) {
                CService::ToStringAddrPort_abi_cxx11_
                          (&local_78,(CService *)&local_158.indirect_contents);
                logging_function_03._M_str = "ConvertSeeds";
                logging_function_03._M_len = 0xc;
                source_file_04._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_04._M_len = 0x50;
                pcVar32 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
                ::LogPrintf_<std::__cxx11::string>
                          (logging_function_03,source_file_04,0xcf,NET,Debug,
                           "Added hardcoded seed: %s\n",&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
              }
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                        (&seed_addrs,(value_type *)&local_158.indirect_contents);
              if (0x10 < (uint)local_148._M_allocated_capacity._0_4_) {
                free(local_158.indirect_contents.indirect);
              }
              if (0x10 < (uint)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent) {
                free((void *)outbound_ipv46_peer_netgroups._M_t._M_impl._0_8_);
              }
            }
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       (local_298 + 8));
            ChaCha20::~ChaCha20((ChaCha20 *)&local_110.__data);
            pCVar8 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar40 = (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            lVar26 = (lVar40 >> 3) * 0x6db6db6db6db6db7 >> 2;
            pCVar35 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0 < lVar26) {
              lVar26 = lVar26 + 1;
              do {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar35);
                criticalblock76.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
                __first._M_current = pCVar35;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001aa7a5;
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)(pCVar35 + 1));
                criticalblock76.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
                __first._M_current = pCVar35 + 1;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001aa7a5;
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)(pCVar35 + 2));
                criticalblock76.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
                __first._M_current = pCVar35 + 2;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001aa7a5;
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)(pCVar35 + 3));
                criticalblock76.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
                __first._M_current = pCVar35 + 3;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001aa7a5;
                pCVar35 = pCVar35 + 4;
                lVar26 = lVar26 + -1;
                lVar40 = lVar40 + -0xe0;
              } while (1 < lVar26);
            }
            lVar26 = (lVar40 >> 3) * 0x6db6db6db6db6db7;
            if (lVar26 == 1) {
LAB_001aa777:
              NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar35);
              criticalblock76.super_unique_lock._M_device =
                   (mutex_type *)CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
              cVar28 = std::
                       _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
              __first._M_current = pCVar35;
              if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0) {
                __first._M_current = pCVar8;
              }
LAB_001aa7a5:
              this_02 = __first._M_current + 1;
              if (this_02 != pCVar8 && __first._M_current != pCVar8) {
                do {
                  NVar21 = CNetAddr::GetNetwork((CNetAddr *)this_02);
                  criticalblock76.super_unique_lock._M_device =
                       (mutex_type *)
                       CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
                  cVar28 = std::
                           _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
                  if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0)
                  {
                    if (0x10 < *(uint *)((direct_or_indirect *)
                                         &((__first._M_current)->super_CService).super_CNetAddr + 1)
                       ) {
                      free((((direct_or_indirect *)
                            &((__first._M_current)->super_CService).super_CNetAddr)->
                           indirect_contents).indirect);
                    }
                    uVar11 = *(undefined8 *)((long)&(this_02->super_CService).super_CNetAddr + 8);
                    (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)
                    ->indirect_contents).indirect =
                         (((direct_or_indirect *)&(this_02->super_CService).super_CNetAddr)->
                         indirect_contents).indirect;
                    *(undefined8 *)
                     ((long)&((__first._M_current)->super_CService).super_CNetAddr + 8) = uVar11;
                    *(size_type *)
                     ((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr +
                     1) = *(size_type *)
                           ((direct_or_indirect *)&(this_02->super_CService).super_CNetAddr + 1);
                    *(size_type *)
                     ((direct_or_indirect *)&(this_02->super_CService).super_CNetAddr + 1) = 0;
                    *(undefined8 *)
                     (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)
                      ->direct + 0x18) =
                         *(undefined8 *)
                          (((direct_or_indirect *)&(this_02->super_CService).super_CNetAddr)->direct
                          + 0x18);
                    ((__first._M_current)->super_CService).port = (this_02->super_CService).port;
                    SVar3 = this_02->nServices;
                    ((__first._M_current)->nTime).__d.__r = (this_02->nTime).__d.__r;
                    (__first._M_current)->nServices = SVar3;
                    __first._M_current = __first._M_current + 1;
                  }
                  this_02 = this_02 + 1;
                } while (this_02 != pCVar8);
              }
            }
            else {
              if (lVar26 == 2) {
LAB_001aa74a:
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar35);
                criticalblock76.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
                __first._M_current = pCVar35;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0) {
                  pCVar35 = pCVar35 + 1;
                  goto LAB_001aa777;
                }
                goto LAB_001aa7a5;
              }
              __first._M_current = pCVar8;
              if (lVar26 == 3) {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar35);
                criticalblock76.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock76.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock76);
                __first._M_current = pCVar35;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0) {
                  pCVar35 = pCVar35 + 1;
                  goto LAB_001aa74a;
                }
                goto LAB_001aa7a5;
              }
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::_M_erase
                      (&seed_addrs,__first,
                       (iterator)
                       seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            CNetAddr::CNetAddr((CNetAddr *)&criticalblock76);
            local_158.indirect_contents.indirect = (char *)&local_148;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"fixedseeds","");
            CNetAddr::SetInternal
                      ((CNetAddr *)&criticalblock76,(string *)&local_158.indirect_contents);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.indirect_contents.indirect != &local_148) {
              operator_delete(local_158.indirect_contents.indirect,
                              (ulong)(local_148._M_allocated_capacity + 1));
            }
            pcVar32 = (char *)0x1aa984;
            AddrMan::Add(this->addrman,&seed_addrs,(CNetAddr *)&criticalblock76,(seconds)0x0);
            local_158.indirect_contents.indirect =
                 (char *)(((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
                         );
            logging_function_05._M_str = "ThreadOpenConnections";
            logging_function_05._M_len = 0x15;
            source_file_06._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_06._M_len = 0x50;
            LogPrintf_<unsigned_long>
                      (logging_function_05,source_file_06,0xa02,
                       I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|
                       ADDRMAN|ESTIMATEFEE|RPC|WALLETDB|ZMQ,(Level)&local_158,pcVar32,
                       (unsigned_long *)CONCAT17(bVar14,in_stack_fffffffffffffb88));
            if (0x10 < (uint)local_110.__data.__lock) {
              free(criticalblock76.super_unique_lock._M_device);
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&seed_addrs);
            bVar13 = false;
          }
        }
        CService::CService((CService *)&local_158.indirect_contents);
        local_130.__r = 100000000;
        p_Stack_128 = (__pthread_internal_list *)0x0;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        criticalblock77.super_unique_lock._8_8_ =
             criticalblock77.super_unique_lock._8_8_ & 0xffffffffffffff00;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        criticalblock77.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock77.super_unique_lock);
        ppCVar43 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar6 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar43 == ppCVar6) {
          local_430 = 0;
          iVar34 = 0;
          uVar36 = 0;
        }
        else {
          uVar36 = 0;
          iVar34 = 0;
          local_430 = 0;
          do {
            pCVar7 = *ppCVar43;
            CVar1 = pCVar7->m_conn_type;
            if ((CVar1 < ADDR_FETCH) && ((0x16U >> (CVar1 & 0x1f) & 1) != 0)) {
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock76,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pCVar7->addr);
              local_110._8_8_ = *(undefined8 *)&(pCVar7->addr).super_CService.super_CNetAddr.m_net;
              local_110.__data.__kind._0_2_ = (pCVar7->addr).super_CService.port;
              local_110.__data.__list.__prev =
                   (__pthread_internal_list *)(pCVar7->addr).nTime.__d.__r;
              local_110.__data.__list.__next = (__pthread_internal_list *)(pCVar7->addr).nServices;
              if ((int)local_110._8_8_ - 3U < 3) {
                local_430 = local_430 + 1;
              }
              else {
                NetGroupManager::GetGroup
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298,
                           this->m_netgroupman,(CNetAddr *)&criticalblock76);
                std::
                _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            *)&outbound_ipv46_peer_netgroups,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298);
                if ((SerParams *)local_298._0_8_ != (SerParams *)0x0) {
                  operator_delete((void *)local_298._0_8_,auStack_288._0_8_ - local_298._0_8_);
                }
              }
              if (0x10 < (uint)local_110.__data.__lock) {
                free(criticalblock76.super_unique_lock._M_device);
              }
            }
            uVar36 = uVar36 + (CVar1 == OUTBOUND_FULL_RELAY);
            iVar34 = iVar34 + (uint)(CVar1 == BLOCK_RELAY);
            ppCVar43 = ppCVar43 + 1;
          } while (ppCVar43 != ppCVar6);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock77.super_unique_lock);
        bVar41 = false;
        if ((local_418 != 0) && (uVar36 < 2)) {
          tVar23 = NodeClock::now();
          if (local_3f0.__r + 10000000000 < (long)tVar23.__d.__r) {
            bVar41 = true;
            local_3f0.__r = (rep)NodeClock::now();
          }
          else {
            bVar41 = false;
          }
        }
        tVar23 = NodeClock::now();
        preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
        super__Optional_payload_base<Network>._4_4_ =
             preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
             super__Optional_payload_base<Network>._4_4_ & 0xffffff00;
        bVar15 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar2 = this->m_max_outbound_block_relay;
        if (iVar2 > iVar34 && !bVar15) {
LAB_001aac8b:
          local_470 = BLOCK_RELAY;
          bVar19 = false;
          goto LAB_001aacba;
        }
        if ((int)uVar36 < this->m_max_outbound_full_relay) {
LAB_001aaca2:
          bVar19 = false;
          local_470 = OUTBOUND_FULL_RELAY;
          goto LAB_001aacba;
        }
        local_470 = BLOCK_RELAY;
        if (iVar34 < iVar2) goto LAB_001aac8b;
        if (((this->m_try_another_outbound_peer)._M_base._M_i & 1U) != 0) goto LAB_001aaca2;
        lVar26 = (long)tVar23.__d.__r / 1000;
        if ((local_400 < lVar26) &&
           (((this->m_start_extra_block_relay_peers)._M_base._M_i & 1U) != 0)) {
          uVar24 = FastRandomContext::rand64(&rng);
          dVar9 = MakeExponentiallyDistributed(uVar24);
          local_400 = lVar26 + (long)ROUND(dVar9 * 300000000.0 + 0.5);
          bVar19 = false;
LAB_001aacba:
          AddrMan::ResolveCollisions(this->addrman);
          local_46c = 0;
          tVar23 = NodeClock::now();
          do {
            while( true ) {
              bVar16 = CThreadInterrupt::operator_cast_to_bool(this_00);
              if (bVar16) goto LAB_001ab835;
              if ((iVar2 <= iVar34 || bVar15) ||
                 (pCVar8 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start == pCVar8)) break;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock76,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(pCVar8 + -1));
              local_110._8_8_ = *(undefined8 *)&pCVar8[-1].super_CService.super_CNetAddr.m_net;
              local_110.__data.__kind._0_2_ = pCVar8[-1].super_CService.port;
              local_110.__data.__list.__prev = (__pthread_internal_list *)pCVar8[-1].nTime.__d.__r;
              local_110.__data.__list.__next = (__pthread_internal_list *)pCVar8[-1].nServices;
              pCVar35 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pCVar8 = pCVar35 + -1;
              (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish = pCVar8;
              if (0x10 < pCVar35[-1].super_CService.super_CNetAddr.m_addr._size) {
                free((pCVar8->super_CService).super_CNetAddr.m_addr._union.indirect_contents.
                     indirect);
                (pCVar8->super_CService).super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              bVar16 = CNetAddr::IsValid((CNetAddr *)&criticalblock76);
              bVar17 = true;
              if ((bVar16) && (bVar16 = IsLocal((CService *)&criticalblock76), !bVar16)) {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)&criticalblock76);
                bVar16 = ReachableNets::Contains(&g_reachable_nets,NVar21);
                if ((bVar16) &&
                   (iVar22 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                       (this->m_msgproc,local_110.__data.__list.__next),
                   (char)iVar22 != '\0')) {
                  NetGroupManager::GetGroup
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298,
                             this->m_netgroupman,(CNetAddr *)&criticalblock76);
                  cVar29 = std::
                           _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::find(&outbound_ipv46_peer_netgroups._M_t,(key_type *)local_298);
                  if ((SerParams *)local_298._0_8_ != (SerParams *)0x0) {
                    operator_delete((void *)local_298._0_8_,auStack_288._0_8_ - local_298._0_8_);
                  }
                  if ((_Rb_tree_header *)cVar29._M_node ==
                      &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header) {
                    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                               &local_158.indirect_contents,
                               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock76)
                    ;
                    local_148._8_8_ = local_110._8_8_;
                    local_138 = local_110.__data.__kind._0_2_;
                    local_130.__r = (rep)local_110.__data.__list.__prev;
                    p_Stack_128 = local_110.__data.__list.__next;
                    pLVar27 = LogInstance();
                    bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
                    if (bVar16) {
                      CService::ToStringAddrPort_abi_cxx11_
                                ((string *)local_298,(CService *)&local_158.indirect_contents);
                      logging_function_06._M_str = "ThreadOpenConnections";
                      logging_function_06._M_len = 0x15;
                      source_file_07._M_str =
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                      ;
                      source_file_07._M_len = 0x50;
                      ::LogPrintf_<std::__cxx11::string>
                                (logging_function_06,source_file_07,0xa90,NET,Debug,
                                 "Trying to make an anchor connection to %s\n",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_298);
                      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                        operator_delete((void *)local_298._0_8_,(ulong)(auStack_288._0_8_ + 1));
                      }
                    }
                    bVar17 = false;
                  }
                }
              }
              if (0x10 < (uint)local_110.__data.__lock) {
                free(criticalblock76.super_unique_lock._M_device);
              }
              if (!bVar17) goto LAB_001ab835;
            }
            if (local_46c == 100) break;
            CService::CService((CService *)local_298);
            local_270.__d.__r = (duration)100000000;
            p_Stack_268 = (__pthread_internal_list *)0x0;
            if (bVar19) {
              AddrMan::SelectTriedCollision
                        ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          *)&criticalblock76,this->addrman);
              if (0x10 < (uint)auStack_288._0_4_) {
                free((void *)local_298._0_8_);
              }
              tVar38.__d.__r = local_e8.__d.__r;
              local_298._0_8_ = criticalblock76.super_unique_lock._M_device;
              local_298._8_8_ = criticalblock76.super_unique_lock._8_8_;
              auStack_288._0_4_ = local_110.__data.__lock;
              local_110.__data.__lock = 0;
              auStack_288._8_8_ = local_110._8_8_;
              auStack_288._16_2_ = local_110.__data.__kind._0_2_;
              local_270.__d.__r = (duration)(duration)local_110.__data.__list.__prev;
              p_Stack_268 = local_110.__data.__list.__next;
              bVar16 = CNetAddr::IsValid((CNetAddr *)local_298);
              if (bVar16) {
                bVar16 = AlreadyConnectedToAddress(this,(CAddress *)local_298);
                if (!bVar16) goto LAB_001ab229;
                this_01 = this->addrman;
                tVar30 = NodeClock::now();
                AddrMan::Good(this_01,(CService *)local_298,
                              (NodeSeconds)((long)tVar30.__d.__r / 1000000000));
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&criticalblock76,this->addrman,true,(optional<Network>)0x0);
              }
              else {
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&criticalblock76,this->addrman,true,(optional<Network>)0x0);
              }
              if (0x10 < (uint)auStack_288._0_4_) {
                free((void *)local_298._0_8_);
              }
              local_298._0_8_ = criticalblock76.super_unique_lock._M_device;
              local_298._8_8_ = criticalblock76.super_unique_lock._8_8_;
              auStack_288._0_4_ = local_110.__data.__lock;
              local_110.__data.__lock = 0;
              auStack_288._8_8_ = local_110._8_8_;
              auStack_288._16_2_ = local_110.__data.__kind._0_2_;
              local_270.__d.__r = (duration)(duration)local_110.__data.__list.__prev;
              p_Stack_268 = local_110.__data.__list.__next;
              tVar38.__d.__r = local_e8.__d.__r;
LAB_001ab229:
              bVar16 = CNetAddr::IsValid((CNetAddr *)local_298);
              if ((!bVar16) || (bVar16 = IsLocal((CService *)local_298), bVar16)) {
LAB_001ab24b:
                bVar16 = false;
              }
              else {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)local_298);
                bVar17 = ReachableNets::Contains(&g_reachable_nets,NVar21);
                bVar16 = true;
                if ((bVar17) &&
                   (599999999999 < (long)tVar38.__d.__r * -1000000000 + (long)tVar23.__d.__r ||
                    0x1c < local_46c)) {
                  if (bVar19) {
                    if (((ulong)p_Stack_268 & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NONE) {
LAB_001ab303:
                      if ((local_46c < 0x31) && (auStack_288._8_4_ - NET_IPV4 < 2)) {
                        uVar20 = CService::GetPort((CService *)local_298);
                        bVar17 = IsBadPort(uVar20);
                        if (bVar17) goto LAB_001ab24d;
                      }
                      bVar17 = AddedNodesContain(this,(CAddress *)local_298);
                      if (!bVar17) {
                        prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                                   &local_158.indirect_contents,
                                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_298);
                        local_148._8_8_ = auStack_288._8_8_;
                        local_138 = auStack_288._16_2_;
                        local_130 = local_270.__d.__r;
                        p_Stack_128 = p_Stack_268;
                        goto LAB_001ab24b;
                      }
                      pLVar27 = LogInstance();
                      bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
                      if (bVar17) {
                        local_378 = "";
                        pcVar32 = "network-specific ";
                        if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                            super__Optional_payload_base<Network>._M_engaged != false) {
                          local_378 = "network-specific ";
                        }
                        ConnectionTypeAsString_abi_cxx11_(&local_2b8,local_470);
                        NVar21 = CNetAddr::GetNetwork((CNetAddr *)local_298);
                        GetNetworkName_abi_cxx11_(&local_2d8,NVar21);
                        bVar17 = fLogIPs;
                        if (fLogIPs == true) {
                          CService::ToStringAddrPort_abi_cxx11_(&local_318,(CService *)local_298);
                          tinyformat::format<std::__cxx11::string>
                                    (&local_2f8,(tinyformat *)0x7fadaa,(char *)&local_318,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pcVar32);
                        }
                        else {
                          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
                        }
                        pLVar27 = LogInstance();
                        bVar18 = BCLog::Logger::Enabled(pLVar27);
                        if (bVar18) {
                          criticalblock76.super_unique_lock._M_device = (mutex_type *)&local_110;
                          criticalblock76.super_unique_lock._M_owns = false;
                          criticalblock76.super_unique_lock._9_7_ = 0;
                          local_110.__data.__lock = local_110.__data.__lock & 0xffffff00;
                          tinyformat::
                          format<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                    (&local_58,
                                     (tinyformat *)
                                     "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n"
                                     ,(char *)&local_378,(char **)&local_2b8,&local_2d8,&local_2f8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(bVar14,in_stack_fffffffffffffb88));
                          ThreadOpenConnections();
                          pLVar27 = LogInstance();
                          criticalblock77.super_unique_lock._M_device = (mutex_type *)&DAT_00000050;
                          criticalblock77.super_unique_lock._8_8_ = anon_var_dwarf_173558;
                          source_file._M_str =
                               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                          ;
                          source_file._M_len = 0x50;
                          str._M_str = (char *)criticalblock76.super_unique_lock._M_device;
                          str._M_len = criticalblock76.super_unique_lock._8_8_;
                          logging_function_09._M_str = "ThreadOpenConnections";
                          logging_function_09._M_len = 0x15;
                          BCLog::Logger::LogPrintStr
                                    (pLVar27,str,logging_function_09,source_file,0xae1,NET,Debug);
                          if ((__native_type *)criticalblock76.super_unique_lock._M_device !=
                              &local_110) {
                            operator_delete(criticalblock76.super_unique_lock._M_device,
                                            CONCAT44(local_110.__data.__count,
                                                     local_110.__data.__lock) + 1);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                          operator_delete(local_2f8._M_dataplus._M_p,
                                          local_2f8.field_2._M_allocated_capacity + 1);
                        }
                        if ((bVar17 != false) &&
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_318._M_dataplus._M_p != &local_318.field_2)) {
                          operator_delete(local_318._M_dataplus._M_p,
                                          local_318.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                          operator_delete(local_2d8._M_dataplus._M_p,
                                          local_2d8.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                          operator_delete(local_2b8._M_dataplus._M_p,
                                          local_2b8.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                  }
                  else {
                    iVar22 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                       (this->m_msgproc,p_Stack_268);
                    if ((char)iVar22 != '\0') goto LAB_001ab303;
                  }
                }
              }
            }
            else {
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._M_engaged =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_engaged;
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._5_3_ =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._5_3_;
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._M_payload._M_value =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_payload._M_value;
              AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               *)&criticalblock76,this->addrman,false,network);
              if (0x10 < (uint)auStack_288._0_4_) {
                free((void *)local_298._0_8_);
              }
              tVar38.__d.__r = local_e8.__d.__r;
              local_298._0_8_ = criticalblock76.super_unique_lock._M_device;
              local_298._8_8_ = criticalblock76.super_unique_lock._8_8_;
              auStack_288._0_4_ = local_110.__data.__lock;
              local_110.__data.__lock = 0;
              auStack_288._8_8_ = local_110._8_8_;
              auStack_288._16_2_ = local_110.__data.__kind._0_2_;
              local_270.__d.__r = (duration)(duration)local_110.__data.__list.__prev;
              p_Stack_268 = local_110.__data.__list.__next;
              NetGroupManager::GetGroup
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&criticalblock76,
                         this->m_netgroupman,(CNetAddr *)local_298);
              cVar29 = std::
                       _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::find(&outbound_ipv46_peer_netgroups._M_t,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &criticalblock76);
              if (criticalblock76.super_unique_lock._M_device != (mutex_type *)0x0) {
                operator_delete(criticalblock76.super_unique_lock._M_device,
                                CONCAT44(local_110.__data.__count,local_110.__data.__lock) -
                                (long)criticalblock76.super_unique_lock._M_device);
              }
              bVar16 = true;
              if ((_Rb_tree_header *)cVar29._M_node ==
                  &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header)
              goto LAB_001ab229;
            }
LAB_001ab24d:
            if (0x10 < (uint)auStack_288._0_4_) {
              free((void *)local_298._0_8_);
            }
            local_46c = local_46c + 1;
          } while (bVar16);
LAB_001ab835:
          bVar15 = CNetAddr::IsValid((CNetAddr *)&local_158.indirect_contents);
          iVar22 = 0;
          if (bVar15) {
            if (bVar19) {
              rel_time = RandomMixin<FastRandomContext>::
                         rand_uniform_duration<std::chrono::_V2::steady_clock>
                                   (&rng.super_RandomMixin<FastRandomContext>,(duration)0x3b9aca00);
              bVar15 = CThreadInterrupt::sleep_for(this_00,rel_time);
              iVar22 = 1;
              if (!bVar15) goto LAB_001aba5b;
              pLVar27 = LogInstance();
              bVar15 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
              if (bVar15) {
                CService::ToStringAddrPort_abi_cxx11_
                          ((string *)&criticalblock76,(CService *)&local_158.indirect_contents);
                logging_function_07._M_str = "ThreadOpenConnections";
                logging_function_07._M_len = 0x15;
                source_file_08._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_08._M_len = 0x50;
                ::LogPrintf_<std::__cxx11::string>
                          (logging_function_07,source_file_08,0xaef,NET,Debug,
                           "Making feeler connection to %s\n",(string *)&criticalblock76);
                if ((__native_type *)criticalblock76.super_unique_lock._M_device != &local_110) {
                  operator_delete(criticalblock76.super_unique_lock._M_device,
                                  CONCAT44(local_110.__data.__count,local_110.__data.__lock) + 1);
                }
              }
            }
            if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network>._M_engaged == true) {
              pLVar27 = LogInstance();
              bVar15 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
              if (bVar15) {
                CService::ToStringAddrPort_abi_cxx11_
                          ((string *)&criticalblock76,(CService *)&local_158.indirect_contents);
                pbVar44 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          0x1ab968;
                GetNetworkName_abi_cxx11_
                          ((string *)local_298,
                           preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                           super__Optional_payload_base<Network>._M_payload._M_value);
                logging_function_08._M_str = "ThreadOpenConnections";
                logging_function_08._M_len = 0x15;
                source_file_09._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_09._M_len = 0x50;
                ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                          (logging_function_08,source_file_09,0xaf2,NET,0x7fd4c8,
                           (char *)&criticalblock76,(string *)local_298,pbVar44);
                if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                  operator_delete((void *)local_298._0_8_,(ulong)(auStack_288._0_8_ + 1));
                }
                if ((__native_type *)criticalblock76.super_unique_lock._M_device != &local_110) {
                  operator_delete(criticalblock76.super_unique_lock._M_device,
                                  CONCAT44(local_110.__data.__count,local_110.__data.__lock) + 1);
                }
              }
            }
            iVar34 = this->m_max_automatic_connections;
            if (2 < iVar34) {
              iVar34 = 3;
            }
            iVar22 = 0;
            OpenNetworkConnection
                      (this,(CAddress *)&local_158.indirect_contents,
                       iVar34 + -1 <=
                       local_430 +
                       (int)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_328,(char *)0x0,local_470,
                       (bool)((byte)((uint)(p_Stack_128._0_4_ & (int)this->nLocalServices) >> 0xb) &
                             1));
          }
        }
        else {
          if (local_408 < lVar26) {
            uVar24 = FastRandomContext::rand64(&rng);
            dVar9 = MakeExponentiallyDistributed(uVar24);
            local_408 = lVar26 + (long)ROUND(dVar9 * 120000000.0 + 0.5);
            local_470 = FEELER;
            bVar19 = true;
            goto LAB_001aacba;
          }
          iVar22 = 10;
          if ((((uVar36 == 8) && (this->m_max_outbound_full_relay == 8)) && (local_410 < lVar26)) &&
             (bVar19 = MaybePickPreferredNetwork(this,&preferred_net), bVar19)) {
            mVar31 = RandomMixin<FastRandomContext>::rand_exp_duration
                               (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
            local_410 = mVar31.__r + lVar26;
            bVar19 = false;
            local_470 = OUTBOUND_FULL_RELAY;
            goto LAB_001aacba;
          }
        }
LAB_001aba5b:
        std::
        _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~_Rb_tree(&outbound_ipv46_peer_netgroups._M_t);
        if (0x10 < (uint)local_148._M_allocated_capacity._0_4_) {
          free(local_158.indirect_contents.indirect);
        }
        std::
        _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&fixed_seed_networks._M_h);
      }
      if (local_328.fHaveGrant == true) {
        CSemaphore::post(local_328.sem);
      }
    } while ((iVar22 == 0) || (iVar22 == 10));
  }
  else {
    SVar3 = this->nLocalServices;
    uVar37 = 0;
    while( true ) {
      for (; pcVar39 != pcVar42; pcVar39 = pcVar39 + 0x20) {
        CService::CService((CService *)&local_230.indirect_contents);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock76,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_230.indirect_contents)
        ;
        local_110._8_8_ = local_218;
        local_110.__data.__kind._0_2_ = local_210;
        local_110.__data.__list.__prev = (__pthread_internal_list *)0x5f5e100;
        local_110.__data.__list.__next = (__pthread_internal_list *)0x0;
        if (0x10 < local_220) {
          free(local_230.indirect_contents.indirect);
          local_230.indirect_contents.indirect = (char *)0x0;
        }
        local_158.indirect_contents.indirect = (char *)0x0;
        local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
        OpenNetworkConnection
                  (this,(CAddress *)&criticalblock76,false,
                   (CSemaphoreGrant *)&local_158.indirect_contents,*(char **)pcVar39,MANUAL,
                   (bool)((byte)(SVar3 >> 0xb) & 1));
        if (local_158.direct[8] == '\x01') {
          CSemaphore::post((CSemaphore *)local_158.indirect_contents.indirect);
        }
        if (uVar37 != 0) {
          uVar33 = 0;
          do {
            bVar13 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
            if (!bVar13) {
              if (0x10 < (uint)local_110.__data.__lock) {
                free(criticalblock76.super_unique_lock._M_device);
              }
              goto LAB_001a9d92;
            }
          } while ((uVar33 < 9) && (uVar33 = uVar33 + 1, uVar33 < uVar37));
        }
        if (0x10 < (uint)local_110.__data.__lock) {
          free(criticalblock76.super_unique_lock._M_device);
        }
      }
      bVar13 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
      if (!bVar13) break;
      PerformReconnections(this);
      uVar37 = uVar37 + 1;
      pcVar39 = (pbVar44->_M_dataplus)._M_p;
      pcVar42 = (pointer)pbVar44->_M_string_length;
    }
  }
LAB_001a9d92:
  ChaCha20::~ChaCha20(&rng.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadOpenConnections(const std::vector<std::string> connect, Span<const std::string> seed_nodes)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    FastRandomContext rng;
    // Connect to specific addresses
    if (!connect.empty())
    {
        // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
        // peer doesn't support it or immediately disconnects us for another reason.
        const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
        for (int64_t nLoop = 0;; nLoop++)
        {
            for (const std::string& strAddr : connect)
            {
                CAddress addr(CService(), NODE_NONE);
                OpenNetworkConnection(addr, false, {}, strAddr.c_str(), ConnectionType::MANUAL, /*use_v2transport=*/use_v2transport);
                for (int i = 0; i < 10 && i < nLoop; i++)
                {
                    if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                        return;
                }
            }
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;
            PerformReconnections();
        }
    }

    // Initiate network connections
    auto start = GetTime<std::chrono::microseconds>();

    // Minimum time before next feeler connection (in microseconds).
    auto next_feeler = start + rng.rand_exp_duration(FEELER_INTERVAL);
    auto next_extra_block_relay = start + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
    auto next_extra_network_peer{start + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL)};
    const bool dnsseed = gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED);
    bool add_fixed_seeds = gArgs.GetBoolArg("-fixedseeds", DEFAULT_FIXEDSEEDS);
    const bool use_seednodes{gArgs.IsArgSet("-seednode")};

    auto seed_node_timer = NodeClock::now();
    bool add_addr_fetch{addrman.Size() == 0 && !seed_nodes.empty()};
    constexpr std::chrono::seconds ADD_NEXT_SEEDNODE = 10s;

    if (!add_fixed_seeds) {
        LogPrintf("Fixed seeds are disabled\n");
    }

    while (!interruptNet)
    {
        if (add_addr_fetch) {
            add_addr_fetch = false;
            const auto& seed{SpanPopBack(seed_nodes)};
            AddAddrFetch(seed);

            if (addrman.Size() == 0) {
                LogInfo("Empty addrman, adding seednode (%s) to addrfetch\n", seed);
            } else {
                LogInfo("Couldn't connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n", ADD_NEXT_SEEDNODE.count(), seed);
            }
        }

        ProcessAddrFetch();

        if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
            return;

        PerformReconnections();

        CSemaphoreGrant grant(*semOutbound);
        if (interruptNet)
            return;

        const std::unordered_set<Network> fixed_seed_networks{GetReachableEmptyNetworks()};
        if (add_fixed_seeds && !fixed_seed_networks.empty()) {
            // When the node starts with an empty peers.dat, there are a few other sources of peers before
            // we fallback on to fixed seeds: -dnsseed, -seednode, -addnode
            // If none of those are available, we fallback on to fixed seeds immediately, else we allow
            // 60 seconds for any of those sources to populate addrman.
            bool add_fixed_seeds_now = false;
            // It is cheapest to check if enough time has passed first.
            if (GetTime<std::chrono::seconds>() > start + std::chrono::minutes{1}) {
                add_fixed_seeds_now = true;
                LogPrintf("Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n");
            }

            // Perform cheap checks before locking a mutex.
            else if (!dnsseed && !use_seednodes) {
                LOCK(m_added_nodes_mutex);
                if (m_added_node_params.empty()) {
                    add_fixed_seeds_now = true;
                    LogPrintf("Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n");
                }
            }

            if (add_fixed_seeds_now) {
                std::vector<CAddress> seed_addrs{ConvertSeeds(m_params.FixedSeeds())};
                // We will not make outgoing connections to peers that are unreachable
                // (e.g. because of -onlynet configuration).
                // Therefore, we do not add them to addrman in the first place.
                // In case previously unreachable networks become reachable
                // (e.g. in case of -onlynet changes by the user), fixed seeds will
                // be loaded only for networks for which we have no addresses.
                seed_addrs.erase(std::remove_if(seed_addrs.begin(), seed_addrs.end(),
                                                [&fixed_seed_networks](const CAddress& addr) { return fixed_seed_networks.count(addr.GetNetwork()) == 0; }),
                                 seed_addrs.end());
                CNetAddr local;
                local.SetInternal("fixedseeds");
                addrman.Add(seed_addrs, local);
                add_fixed_seeds = false;
                LogPrintf("Added %d fixed seeds from reachable networks.\n", seed_addrs.size());
            }
        }

        //
        // Choose an address to connect to based on most recently seen
        //
        CAddress addrConnect;

        // Only connect out to one peer per ipv4/ipv6 network group (/16 for IPv4).
        int nOutboundFullRelay = 0;
        int nOutboundBlockRelay = 0;
        int outbound_privacy_network_peers = 0;
        std::set<std::vector<unsigned char>> outbound_ipv46_peer_netgroups;

        {
            LOCK(m_nodes_mutex);
            for (const CNode* pnode : m_nodes) {
                if (pnode->IsFullOutboundConn()) nOutboundFullRelay++;
                if (pnode->IsBlockOnlyConn()) nOutboundBlockRelay++;

                // Make sure our persistent outbound slots to ipv4/ipv6 peers belong to different netgroups.
                switch (pnode->m_conn_type) {
                    // We currently don't take inbound connections into account. Since they are
                    // free to make, an attacker could make them to prevent us from connecting to
                    // certain peers.
                    case ConnectionType::INBOUND:
                    // Short-lived outbound connections should not affect how we select outbound
                    // peers from addrman.
                    case ConnectionType::ADDR_FETCH:
                    case ConnectionType::FEELER:
                        break;
                    case ConnectionType::MANUAL:
                    case ConnectionType::OUTBOUND_FULL_RELAY:
                    case ConnectionType::BLOCK_RELAY:
                        const CAddress address{pnode->addr};
                        if (address.IsTor() || address.IsI2P() || address.IsCJDNS()) {
                            // Since our addrman-groups for these networks are
                            // random, without relation to the route we
                            // take to connect to these peers or to the
                            // difficulty in obtaining addresses with diverse
                            // groups, we don't worry about diversity with
                            // respect to our addrman groups when connecting to
                            // these networks.
                            ++outbound_privacy_network_peers;
                        } else {
                            outbound_ipv46_peer_netgroups.insert(m_netgroupman.GetGroup(address));
                        }
                } // no default case, so the compiler can warn about missing cases
            }
        }

        if (!seed_nodes.empty() && nOutboundFullRelay < SEED_OUTBOUND_CONNECTION_THRESHOLD) {
            if (NodeClock::now() > seed_node_timer + ADD_NEXT_SEEDNODE) {
                seed_node_timer = NodeClock::now();
                add_addr_fetch = true;
            }
        }

        ConnectionType conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
        auto now = GetTime<std::chrono::microseconds>();
        bool anchor = false;
        bool fFeeler = false;
        std::optional<Network> preferred_net;

        // Determine what type of connection to open. Opening
        // BLOCK_RELAY connections to addresses from anchors.dat gets the highest
        // priority. Then we open OUTBOUND_FULL_RELAY priority until we
        // meet our full-relay capacity. Then we open BLOCK_RELAY connection
        // until we hit our block-relay-only peer limit.
        // GetTryNewOutboundPeer() gets set when a stale tip is detected, so we
        // try opening an additional OUTBOUND_FULL_RELAY connection. If none of
        // these conditions are met, check to see if it's time to try an extra
        // block-relay-only peer (to confirm our tip is current, see below) or the next_feeler
        // timer to decide if we should open a FEELER.

        if (!m_anchors.empty() && (nOutboundBlockRelay < m_max_outbound_block_relay)) {
            conn_type = ConnectionType::BLOCK_RELAY;
            anchor = true;
        } else if (nOutboundFullRelay < m_max_outbound_full_relay) {
            // OUTBOUND_FULL_RELAY
        } else if (nOutboundBlockRelay < m_max_outbound_block_relay) {
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (GetTryNewOutboundPeer()) {
            // OUTBOUND_FULL_RELAY
        } else if (now > next_extra_block_relay && m_start_extra_block_relay_peers) {
            // Periodically connect to a peer (using regular outbound selection
            // methodology from addrman) and stay connected long enough to sync
            // headers, but not much else.
            //
            // Then disconnect the peer, if we haven't learned anything new.
            //
            // The idea is to make eclipse attacks very difficult to pull off,
            // because every few minutes we're finding a new peer to learn headers
            // from.
            //
            // This is similar to the logic for trying extra outbound (full-relay)
            // peers, except:
            // - we do this all the time on an exponential timer, rather than just when
            //   our tip is stale
            // - we potentially disconnect our next-youngest block-relay-only peer, if our
            //   newest block-relay-only peer delivers a block more recently.
            //   See the eviction logic in net_processing.cpp.
            //
            // Because we can promote these connections to block-relay-only
            // connections, they do not get their own ConnectionType enum
            // (similar to how we deal with extra outbound peers).
            next_extra_block_relay = now + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (now > next_feeler) {
            next_feeler = now + rng.rand_exp_duration(FEELER_INTERVAL);
            conn_type = ConnectionType::FEELER;
            fFeeler = true;
        } else if (nOutboundFullRelay == m_max_outbound_full_relay &&
                   m_max_outbound_full_relay == MAX_OUTBOUND_FULL_RELAY_CONNECTIONS &&
                   now > next_extra_network_peer &&
                   MaybePickPreferredNetwork(preferred_net)) {
            // Full outbound connection management: Attempt to get at least one
            // outbound peer from each reachable network by making extra connections
            // and then protecting "only" peers from a network during outbound eviction.
            // This is not attempted if the user changed -maxconnections to a value
            // so low that less than MAX_OUTBOUND_FULL_RELAY_CONNECTIONS are made,
            // to prevent interactions with otherwise protected outbound peers.
            next_extra_network_peer = now + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL);
        } else {
            // skip to next iteration of while loop
            continue;
        }

        addrman.ResolveCollisions();

        const auto current_time{NodeClock::now()};
        int nTries = 0;
        while (!interruptNet)
        {
            if (anchor && !m_anchors.empty()) {
                const CAddress addr = m_anchors.back();
                m_anchors.pop_back();
                if (!addr.IsValid() || IsLocal(addr) || !g_reachable_nets.Contains(addr) ||
                    !m_msgproc->HasAllDesirableServiceFlags(addr.nServices) ||
                    outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) continue;
                addrConnect = addr;
                LogDebug(BCLog::NET, "Trying to make an anchor connection to %s\n", addrConnect.ToStringAddrPort());
                break;
            }

            // If we didn't find an appropriate destination after trying 100 addresses fetched from addrman,
            // stop this loop, and let the outer loop run again (which sleeps, adds seed nodes, recalculates
            // already-connected network ranges, ...) before trying new addrman addresses.
            nTries++;
            if (nTries > 100)
                break;

            CAddress addr;
            NodeSeconds addr_last_try{0s};

            if (fFeeler) {
                // First, try to get a tried table collision address. This returns
                // an empty (invalid) address if there are no collisions to try.
                std::tie(addr, addr_last_try) = addrman.SelectTriedCollision();

                if (!addr.IsValid()) {
                    // No tried table collisions. Select a new table address
                    // for our feeler.
                    std::tie(addr, addr_last_try) = addrman.Select(true);
                } else if (AlreadyConnectedToAddress(addr)) {
                    // If test-before-evict logic would have us connect to a
                    // peer that we're already connected to, just mark that
                    // address as Good(). We won't be able to initiate the
                    // connection anyway, so this avoids inadvertently evicting
                    // a currently-connected peer.
                    addrman.Good(addr);
                    // Select a new table address for our feeler instead.
                    std::tie(addr, addr_last_try) = addrman.Select(true);
                }
            } else {
                // Not a feeler
                // If preferred_net has a value set, pick an extra outbound
                // peer from that network. The eviction logic in net_processing
                // ensures that a peer from another network will be evicted.
                std::tie(addr, addr_last_try) = addrman.Select(false, preferred_net);
            }

            // Require outbound IPv4/IPv6 connections, other than feelers, to be to distinct network groups
            if (!fFeeler && outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) {
                continue;
            }

            // if we selected an invalid or local address, restart
            if (!addr.IsValid() || IsLocal(addr)) {
                break;
            }

            if (!g_reachable_nets.Contains(addr)) {
                continue;
            }

            // only consider very recently tried nodes after 30 failed attempts
            if (current_time - addr_last_try < 10min && nTries < 30) {
                continue;
            }

            // for non-feelers, require all the services we'll want,
            // for feelers, only require they be a full node (only because most
            // SPV clients don't have a good address DB available)
            if (!fFeeler && !m_msgproc->HasAllDesirableServiceFlags(addr.nServices)) {
                continue;
            } else if (fFeeler && !MayHaveUsefulAddressDB(addr.nServices)) {
                continue;
            }

            // Do not connect to bad ports, unless 50 invalid addresses have been selected already.
            if (nTries < 50 && (addr.IsIPv4() || addr.IsIPv6()) && IsBadPort(addr.GetPort())) {
                continue;
            }

            // Do not make automatic outbound connections to addnode peers, to
            // not use our limited outbound slots for them and to ensure
            // addnode connections benefit from their intended protections.
            if (AddedNodesContain(addr)) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n",
                              preferred_net.has_value() ? "network-specific " : "",
                              ConnectionTypeAsString(conn_type), GetNetworkName(addr.GetNetwork()),
                              fLogIPs ? strprintf(": %s", addr.ToStringAddrPort()) : "");
                continue;
            }

            addrConnect = addr;
            break;
        }

        if (addrConnect.IsValid()) {
            if (fFeeler) {
                // Add small amount of random noise before connection to avoid synchronization.
                if (!interruptNet.sleep_for(rng.rand_uniform_duration<CThreadInterrupt::Clock>(FEELER_SLEEP_WINDOW))) {
                    return;
                }
                LogDebug(BCLog::NET, "Making feeler connection to %s\n", addrConnect.ToStringAddrPort());
            }

            if (preferred_net != std::nullopt) LogDebug(BCLog::NET, "Making network specific connection to %s on %s.\n", addrConnect.ToStringAddrPort(), GetNetworkName(preferred_net.value()));

            // Record addrman failure attempts when node has at least 2 persistent outbound connections to peers with
            // different netgroups in ipv4/ipv6 networks + all peers in Tor/I2P/CJDNS networks.
            // Don't record addrman failure attempts when node is offline. This can be identified since all local
            // network connections (if any) belong in the same netgroup, and the size of `outbound_ipv46_peer_netgroups` would only be 1.
            const bool count_failures{((int)outbound_ipv46_peer_netgroups.size() + outbound_privacy_network_peers) >= std::min(m_max_automatic_connections - 1, 2)};
            // Use BIP324 transport when both us and them have NODE_V2_P2P set.
            const bool use_v2transport(addrConnect.nServices & GetLocalServices() & NODE_P2P_V2);
            OpenNetworkConnection(addrConnect, count_failures, std::move(grant), /*strDest=*/nullptr, conn_type, use_v2transport);
        }
    }
}